

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disk_io_thread.cpp
# Opt level: O2

int __thiscall
libtorrent::disk_io_thread::flush_range
          (disk_io_thread *this,cached_piece_entry *pe,int start,int end,jobqueue_t *completed_jobs,
          unique_lock<std::mutex> *l)

{
  undefined8 *puVar1;
  undefined8 this_00;
  scoped_unlocker_impl<std::unique_lock<std::mutex>_> sVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  long TORRENT_ALLOCA_size;
  undefined4 extraout_var;
  ulong uVar6;
  int *flushing;
  span<char> *psVar7;
  span<libtorrent::span<char>_> iov;
  span<const_int> flushing_00;
  span<const_libtorrent::span<char>_> iov_00;
  int aiStack_a0 [2];
  span<int> sStack_98;
  int aiStack_88 [2];
  long lStack_80;
  span<char> local_78;
  undefined1 local_68 [8];
  storage_error error;
  scoped_unlocker_impl<std::unique_lock<std::mutex>_> local_40;
  scoped_unlocker_impl<std::unique_lock<std::mutex>_> unlocker;
  
  error._16_8_ = l;
  uVar4 = *(uint *)&pe->field_0x80 & 0x3fff;
  psVar7 = (span<char> *)((long)&local_78 - (ulong)(uVar4 << 4));
  for (uVar6 = 0; uVar4 << 4 != uVar6; uVar6 = uVar6 + 0x10) {
    puVar1 = (undefined8 *)((long)&psVar7->m_ptr + uVar6);
    *puVar1 = 0;
    puVar1[1] = 0;
  }
  flushing = (int *)((long)psVar7 - (ulong)(uVar4 * 4 + 0xf & 0xfffffff0));
  local_78.m_ptr = (char *)flushing;
  local_78.m_len = (ulong)uVar4;
  *(int **)(flushing + -8) = flushing;
  *(ulong *)(flushing + -6) = (ulong)uVar4;
  flushing[-4] = 0;
  flushing[-10] = 0x2dc7a3;
  flushing[-9] = 0;
  iov.m_len = (difference_type)l;
  iov.m_ptr = psVar7;
  iVar5 = build_iovec(this,pe,start,end,iov,*(span<int> *)(flushing + -8),flushing[-4]);
  this_00 = error._16_8_;
  unlocker.m_lock = (unique_lock<std::mutex> *)CONCAT44(extraout_var,iVar5);
  if (iVar5 != 0) {
    local_68._0_4_ = 0;
    local_68[4] = false;
    error.ec._0_8_ = &boost::system::detail::cat_holder<void>::system_category_instance;
    error.ec.cat_._0_4_ = 0xffffff;
    uVar6 = *(ulong *)&pe->field_0x7c + 0x20000000000000 & 0xfe0000000000000;
    *(ulong *)&pe->field_0x7c = *(ulong *)&pe->field_0x7c & 0xf01fffffffffffff | uVar6;
    local_40.m_lock = (unique_lock<std::mutex> *)error._16_8_;
    flushing[-2] = 0x2dc813;
    flushing[-1] = 0;
    std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)this_00);
    *(undefined1 **)(flushing + -2) = local_68;
    sVar2 = unlocker;
    *(unique_lock<std::mutex> **)(flushing + -4) = unlocker.m_lock;
    flushing[-6] = 0x2dc82f;
    flushing[-5] = 0;
    flushing_00.m_len = (difference_type)l;
    flushing_00.m_ptr = flushing;
    iov_00.m_len = uVar6;
    iov_00.m_ptr = psVar7;
    flush_iovec(this,pe,iov_00,flushing_00,flushing[-4],*(storage_error **)(flushing + -2));
    flushing[-2] = 0x2dc83a;
    flushing[-1] = 0;
    anon_unknown_0::scoped_unlocker_impl<std::unique_lock<std::mutex>_>::~scoped_unlocker_impl
              (&local_40);
    *(ulong *)&pe->field_0x7c =
         *(ulong *)&pe->field_0x7c & 0xf01fffffffffffff |
         *(ulong *)&pe->field_0x7c + 0xfe0000000000000 & 0xfe0000000000000;
    *(jobqueue_t **)(flushing + -4) = completed_jobs;
    flushing[-6] = 0x2dc878;
    flushing[-5] = 0;
    bVar3 = iovec_flushed(this,pe,flushing,(int)sVar2.m_lock,0,(storage_error *)local_68,
                          *(jobqueue_t **)(flushing + -4));
    if (!bVar3) {
      flushing[-2] = 0x2dc88e;
      flushing[-1] = 0;
      block_cache::maybe_free_piece(&this->m_disk_cache,pe);
    }
    flushing[-2] = 0x2dc89f;
    flushing[-1] = 0;
    iVar5 = disk_buffer_pool::num_to_evict(&(this->m_disk_cache).super_disk_buffer_pool,0);
    if (0 < iVar5) {
      flushing[-2] = 0x2dc8af;
      flushing[-1] = 0;
      block_cache::try_evict_blocks(&this->m_disk_cache,iVar5,(cached_piece_entry *)0x0);
    }
  }
  return (int)unlocker.m_lock;
}

Assistant:

int disk_io_thread::flush_range(cached_piece_entry* pe, int const start, int const end
		, jobqueue_t& completed_jobs, std::unique_lock<std::mutex>& l)
	{
		TORRENT_ASSERT(l.owns_lock());

		DLOG("flush_range: piece=%d [%d, %d)\n"
			, static_cast<int>(pe->piece), start, end);
		TORRENT_PIECE_ASSERT(start >= 0, pe);
		TORRENT_PIECE_ASSERT(start < end, pe);

		TORRENT_ALLOCA(iov, iovec_t, pe->blocks_in_piece);
		TORRENT_ALLOCA(flushing, int, pe->blocks_in_piece);
		int const iov_len = build_iovec(pe, start, end, iov, flushing, 0);
		if (iov_len == 0) return 0;

		TORRENT_PIECE_ASSERT(pe->cache_state <= cached_piece_entry::read_lru1 || pe->cache_state == cached_piece_entry::read_lru2, pe);
#if TORRENT_USE_ASSERTS
		pe->piece_log.push_back(piece_log_t(piece_log_t::flush_range, -1));
#endif

		storage_error error;
		{
			piece_refcount_holder refcount_holder(pe);
			auto unlocker = scoped_unlock(l);

			flush_iovec(pe, iov, flushing, iov_len, error);
		}

		if (!iovec_flushed(pe, flushing.data(), iov_len, 0, error, completed_jobs))
			m_disk_cache.maybe_free_piece(pe);

		// if the cache is under high pressure, we need to evict
		// the blocks we just flushed to make room for more write pieces
		int const evict = m_disk_cache.num_to_evict(0);
		if (evict > 0) m_disk_cache.try_evict_blocks(evict);

		return iov_len;
	}